

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

void __thiscall
gl4cts::TextureViewTestViewSampling::deinitPerSampleFillerProgramAndShaderObjects
          (TextureViewTestViewSampling *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_per_sample_filler_fs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_per_sample_filler_fs_id = 0;
  }
  if (this->m_per_sample_filler_gs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_per_sample_filler_gs_id = 0;
  }
  if (this->m_per_sample_filler_po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_per_sample_filler_po_id = 0;
  }
  if (this->m_per_sample_filler_vs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_per_sample_filler_vs_id = 0;
  }
  return;
}

Assistant:

void TextureViewTestViewSampling::deinitPerSampleFillerProgramAndShaderObjects()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_per_sample_filler_fs_id != 0)
	{
		gl.deleteShader(m_per_sample_filler_fs_id);

		m_per_sample_filler_fs_id = 0;
	}

	if (m_per_sample_filler_gs_id != 0)
	{
		gl.deleteShader(m_per_sample_filler_gs_id);

		m_per_sample_filler_gs_id = 0;
	}

	if (m_per_sample_filler_po_id != 0)
	{
		gl.deleteProgram(m_per_sample_filler_po_id);

		m_per_sample_filler_po_id = 0;
	}

	if (m_per_sample_filler_vs_id != 0)
	{
		gl.deleteShader(m_per_sample_filler_vs_id);

		m_per_sample_filler_vs_id = 0;
	}
}